

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

String __thiscall xmrig::Process::location(Process *this,Location location,char *fileName)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  char *in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  int iVar4;
  size_t sVar5;
  String SVar6;
  size_t size;
  
  __s = (char *)operator_new__(0x208);
  memset(__s,0,0x208);
  size = 0x208;
  iVar4 = (int)fileName;
  if (iVar4 == 1) {
    iVar1 = uv_cwd(__s,&size);
LAB_001503c2:
    if ((-1 < iVar1) && (size != 0)) {
      if (in_RCX != (char *)0x0) {
        sVar5 = size;
        if (iVar4 == 0) {
          pcVar2 = strrchr(__s,0x2f);
          if (pcVar2 == (char *)0x0) goto LAB_00150408;
          sVar5 = (long)pcVar2 - (long)__s;
        }
        sVar3 = strlen(in_RCX);
        if ((sVar3 + sVar5) - 0x206 < 0xfffffffffffffdf8) goto LAB_00150408;
        __s[sVar5] = '/';
        strcpy(__s + sVar5 + 1,in_RCX);
      }
      String::String((String *)this,__s);
      sVar5 = extraout_RDX_00;
      goto LAB_00150416;
    }
  }
  else if (iVar4 == 0) {
    iVar1 = uv_exepath(__s,&size);
    goto LAB_001503c2;
  }
LAB_00150408:
  operator_delete__(__s);
  (this->m_arguments).m_argv = (char **)0x0;
  *(undefined8 *)&(this->m_arguments).m_argc = 0;
  sVar5 = extraout_RDX;
LAB_00150416:
  SVar6.m_size = sVar5;
  SVar6.m_data = (char *)this;
  return SVar6;
}

Assistant:

xmrig::String xmrig::Process::location(Location location, const char *fileName) const
{
    constexpr const size_t max = 520;

    char *buf   = new char[max]();
    size_t size = ::location(location, buf, max);

    if (size == 0) {
        delete [] buf;

        return String();
    }

    if (fileName == nullptr) {
        return buf;
    }

    if (location == ExeLocation) {
        char *p = strrchr(buf, kDirSeparator);

        if (p == nullptr) {
            delete [] buf;

            return String();
        }

        size = static_cast<size_t>(p - buf);
    }

    if ((size + strlen(fileName) + 2) >= max) {
        delete [] buf;

        return String();
    }

    buf[size] = kDirSeparator;
    strcpy(buf + size + 1, fileName);

    return buf;
}